

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall pbrt::Atof(pbrt *this,string_view str,float *ptr)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  undefined8 uVar3;
  float fVar4;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,str._M_len,this + str._M_len);
  __nptr = local_58[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  fVar4 = strtof((char *)__nptr,(char **)&local_38);
  if (local_38 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stof");
    __cxa_begin_catch(uVar3);
    __cxa_end_catch();
    return false;
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_002d9923;
    fVar4 = (float)std::__throw_out_of_range("stof");
  }
  *piVar2 = iVar1;
LAB_002d9923:
  *(float *)str._M_str = fVar4;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return true;
}

Assistant:

bool Atof(std::string_view str, float *ptr) {
    try {
        *ptr = std::stof(std::string(str.begin(), str.end()));
    } catch (...) {
        return false;
    }
    return true;
}